

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea_p.hpp
# Opt level: O2

void __thiscall
QtMWidgets::AbstractScrollAreaPrivate::AbstractScrollAreaPrivate
          (AbstractScrollAreaPrivate *this,AbstractScrollArea *parent)

{
  this->_vptr_AbstractScrollAreaPrivate = (_func_int **)&PTR__AbstractScrollAreaPrivate_001ab080;
  this->q = parent;
  (this->indicatorColor).cspec = Invalid;
  (this->indicatorColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this->indicatorColor).ct + 2) = 0;
  (this->mousePos).xp = 0;
  (this->mousePos).yp = 0;
  this->viewport = (QWidget *)0x0;
  (this->scrolledAreaSize).wd = 0;
  (this->scrolledAreaSize).ht = 0;
  (this->topLeftCorner).xp = 0;
  (this->topLeftCorner).yp = 0;
  this->top = 0;
  this->bottom = 0;
  *(undefined8 *)((long)&this->top + 1) = 0;
  *(undefined8 *)((long)&this->right + 1) = 0;
  this->horIndicator = (ScrollIndicator *)0x0;
  this->vertIndicator = (ScrollIndicator *)0x0;
  this->animationTimer = (QTimer *)0x0;
  this->startBlurAnimTimer = (QTimer *)0x0;
  this->animationTimeout = 100;
  this->animationAlphaDelta = 0x19;
  this->scroller = (Scroller *)0x0;
  this->horBlur = (BlurEffect *)0x0;
  this->vertBlur = (BlurEffect *)0x0;
  this->horBlurAnim = (QVariantAnimation *)0x0;
  this->vertBlurAnim = (QVariantAnimation *)0x0;
  return;
}

Assistant:

explicit AbstractScrollAreaPrivate( AbstractScrollArea * parent )
		:	q( parent )
		,	viewport( 0 )
		,	scrolledAreaSize( 0, 0 )
		,	topLeftCorner( 0, 0 )
		,	top( 0 )
		,	bottom( 0 )
		,	right( 0 )
		,	left( 0 )
		,	leftMouseButtonPressed( false )
		,	horIndicator( 0 )
		,	vertIndicator( 0 )
		,	animationTimer( 0 )
		,	startBlurAnimTimer( 0 )
		,	animationTimeout( 100 )
		,	animationAlphaDelta( 25 )
		,	scroller( 0 )
		,	horBlur( 0 )
		,	vertBlur( 0 )
		,	horBlurAnim( 0 )
		,	vertBlurAnim( 0 )
	{
	}